

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall
QRhiGles2::enqueueSubresUpload
          (QRhiGles2 *this,QGles2Texture *texD,QGles2CommandBuffer *cbD,int layer,int level,
          QRhiTextureSubresourceUploadDescription *subresDesc)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  int iVar6;
  Format format;
  Command *pCVar7;
  void *pvVar8;
  QSize QVar9;
  QSize QVar10;
  uchar *puVar11;
  qsizetype bytesPerLine;
  qsizetype qVar12;
  uint uVar13;
  Representation RVar14;
  qint32 qVar15;
  QPoint QVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  Representation RVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_108;
  char *local_f0;
  quint32 byteSize;
  anon_class_80_10_ff4bedf3 local_c8;
  QArrayDataPointer<char> local_78;
  QPoint local_60;
  GLenum effectiveTarget;
  bool isArray;
  bool is1D;
  bool is3D;
  int level_local;
  int layer_local;
  QGles2CommandBuffer *cbD_local;
  QGles2Texture *texD_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  level_local = level;
  layer_local = layer;
  cbD_local = cbD;
  texD_local = texD;
  trackedImageBarrier(this,cbD,texD,AccessUpdate);
  bVar3 = QRhiImplementation::isCompressedFormat
                    (&this->super_QRhiImplementation,(texD->super_QRhiTexture).m_format);
  uVar1 = (texD->super_QRhiTexture).m_flags.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
          super_QFlagsStorage<QRhiTexture::Flag>.i;
  is3D = (bool)((byte)(uVar1 >> 10) & 1);
  is1D = (bool)((byte)(uVar1 >> 0xd) & 1);
  isArray = (bool)((byte)(uVar1 >> 0xc) & 1);
  GVar5 = 0x8515;
  if ((uVar1 & 4) == 0) {
    GVar5 = texD->target;
    layer = 0;
  }
  effectiveTarget = layer + GVar5;
  local_60 = subresDesc->m_destinationTopLeft;
  local_78.d = (subresDesc->m_data).d.d;
  local_78.ptr = (subresDesc->m_data).d.ptr;
  local_78.size = (subresDesc->m_data).d.size;
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.texD = &texD_local;
  local_c8.cbD = &cbD_local;
  local_c8.effectiveTarget = &effectiveTarget;
  local_c8.level = &level_local;
  local_c8.dp = &local_60;
  local_c8.is1D = &is1D;
  local_c8.isArray = &isArray;
  local_c8.layer = &layer_local;
  local_c8.is3D = &is3D;
  local_c8.this = this;
  QImage::QImage((QImage *)&local_108,&subresDesc->m_image);
  bVar4 = QImage::isNull((QImage *)&local_108);
  QImage::~QImage((QImage *)&local_108);
  if (bVar4) {
    if (bVar3 && local_78.size != 0) {
      uVar19 = (texD_local->super_QRhiTexture).m_depth;
      uVar18 = (texD_local->super_QRhiTexture).m_arraySize;
      uVar17 = 1;
      if (1 < (int)uVar19) {
        uVar17 = uVar19;
      }
      uVar19 = 0;
      if (0 < (int)uVar18) {
        uVar19 = uVar18;
      }
      if ((((((texD_local->super_QRhiTexture).m_flags.
              super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.super_QFlagsStorage<QRhiTexture::Flag>
              .i & 0x100) != 0) || (is3D != false)) || (isArray == true)) &&
         (texD_local->zeroInitialized == false)) {
        byteSize = 0;
        QRhiImplementation::compressedFormatInfo
                  (&this->super_QRhiImplementation,(texD_local->super_QRhiTexture).m_format,
                   &(texD_local->super_QRhiTexture).m_pixelSize,(quint32 *)0x0,&byteSize,
                   (QSize *)0x0);
        if (is3D == true) {
          byteSize = byteSize * uVar17;
        }
        if (isArray == true) {
          byteSize = byteSize * uVar19;
        }
        local_108.size._0_4_ = 0xaaaaaaaa;
        local_108.size._4_4_ = 0xaaaaaaaa;
        local_108.d._0_4_ = 0xaaaaaaaa;
        local_108.d._4_4_ = 0xaaaaaaaa;
        local_108.ptr._0_4_ = 0xaaaaaaaa;
        local_108.ptr._4_4_ = 0xaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)&local_108,(ulong)byteSize,'\0');
        pCVar7 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                           (&cbD_local->commands);
        pCVar7->cmd = CompressedImage;
        (pCVar7->args).beginFrame.timestampQuery = texD_local->target;
        (pCVar7->args).viewport.y = *(float *)&(texD_local->super_QRhiTexture).field_0x64;
        (pCVar7->args).bindIndexBuffer.type = effectiveTarget;
        (pCVar7->args).scissor.h = level_local;
        (pCVar7->args).viewport.d0 = (float)texD_local->glintformat;
        (pCVar7->args).viewport.d1 = (float)(texD_local->super_QRhiTexture).m_pixelSize.wd.m_i;
        uVar18 = uVar19;
        uVar13 = uVar19;
        if ((is1D & isArray) == 0) {
          uVar13 = 0;
          if ((isArray & 1U) != 0) {
            uVar13 = uVar19;
          }
          uVar18 = (texD_local->super_QRhiTexture).m_pixelSize.ht.m_i;
          if (is1D != false) {
            uVar13 = 0;
          }
        }
        (pCVar7->args).drawIndexed.baseVertex = uVar18;
        if (is3D != false) {
          uVar13 = uVar17;
        }
        (pCVar7->args).bindShaderResources.dynamicOffsetPairs[0] = uVar13;
        (pCVar7->args).bindShaderResources.dynamicOffsetPairs[1] = byteSize;
        pvVar8 = QGles2CommandBuffer::retainData(cbD_local,(QByteArray *)&local_108);
        (pCVar7->args).compressedImage.data = pvVar8;
        texD_local->zeroInitialized = true;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
      }
      QVar9 = subresDesc->m_sourceSize;
      RVar20 = QVar9.ht.m_i;
      if (RVar20.m_i < 1 || QVar9.wd.m_i.m_i < 1) {
        QVar9 = QRhi::sizeForMipLevel(level_local,&(texD_local->super_QRhiTexture).m_pixelSize);
        RVar20 = QVar9.ht.m_i;
      }
      if ((texD_local->specified == false) && (texD_local->zeroInitialized != true)) {
        pCVar7 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                           (&cbD_local->commands);
        pCVar7->cmd = CompressedImage;
        (pCVar7->args).beginFrame.timestampQuery = texD_local->target;
        (pCVar7->args).viewport.y = *(float *)&(texD_local->super_QRhiTexture).field_0x64;
        (pCVar7->args).bindIndexBuffer.type = effectiveTarget;
        (pCVar7->args).scissor.h = level_local;
        (pCVar7->args).viewport.d0 = (float)texD_local->glintformat;
        (pCVar7->args).draw.baseInstance = QVar9.wd.m_i.m_i;
        uVar18 = RVar20.m_i;
        if ((isArray & 1U) != 0) {
          uVar18 = uVar19;
        }
        if (is1D == false) {
          uVar18 = RVar20.m_i;
        }
        (pCVar7->args).drawIndexed.baseVertex = uVar18;
        uVar18 = 0;
        if ((isArray & 1U) != 0) {
          uVar18 = uVar19;
        }
        if (is3D != false) {
          uVar18 = uVar17;
        }
        (pCVar7->args).bindShaderResources.dynamicOffsetPairs[0] = uVar18;
        (pCVar7->args).bindShaderResources.dynamicOffsetPairs[1] = (uint)local_78.size;
        pvVar8 = QGles2CommandBuffer::retainData(cbD_local,(QByteArray *)&local_78);
        (pCVar7->args).compressedImage.data = pvVar8;
      }
      else {
        pCVar7 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                           (&cbD_local->commands);
        pCVar7->cmd = CompressedSubImage;
        (pCVar7->args).beginFrame.timestampQuery = texD_local->target;
        (pCVar7->args).viewport.y = *(float *)&(texD_local->super_QRhiTexture).field_0x64;
        (pCVar7->args).bindIndexBuffer.type = effectiveTarget;
        (pCVar7->args).scissor.h = level_local;
        (pCVar7->args).bindVertexBuffer.binding = local_60.xp.m_i;
        if ((is1D != true) || (RVar14.m_i = layer_local, isArray != true)) {
          RVar14.m_i = local_60.yp.m_i;
        }
        (pCVar7->args).draw.baseInstance = RVar14.m_i;
        if ((is3D != false) || (qVar15 = 0, isArray == true)) {
          qVar15 = layer_local;
        }
        (pCVar7->args).drawIndexed.baseVertex = qVar15;
        (pCVar7->args).bindShaderResources.dynamicOffsetPairs[0] = QVar9.wd.m_i.m_i;
        (pCVar7->args).subImage.h = RVar20.m_i;
        (pCVar7->args).bindShaderResources.dynamicOffsetPairs[2] = texD_local->glintformat;
        (pCVar7->args).bindShaderResources.dynamicOffsetPairs[3] = (uint)local_78.size;
        pvVar8 = QGles2CommandBuffer::retainData(cbD_local,(QByteArray *)&local_78);
        (pCVar7->args).compressedSubImage.data = pvVar8;
      }
    }
    else if (local_78.size == 0) {
      local_108.d._0_4_ = 2;
      local_108.d._4_4_ = 0;
      local_108.ptr._0_4_ = 0;
      local_108.ptr._4_4_ = 0;
      local_108.size._0_4_ = 0;
      local_108.size._4_4_ = 0;
      local_f0 = "default";
      QMessageLogger::warning
                ((char *)&local_108,"Invalid texture upload for %p layer=%d mip=%d",texD_local,
                 (ulong)(uint)layer_local,(ulong)(uint)level_local);
    }
    else {
      QVar9 = subresDesc->m_sourceSize;
      if (QVar9.ht.m_i.m_i < 1 || QVar9.wd.m_i.m_i < 1) {
        QVar9 = QRhi::sizeForMipLevel(level_local,&(texD_local->super_QRhiTexture).m_pixelSize);
      }
      pvVar8 = QGles2CommandBuffer::retainData(cbD_local,(QByteArray *)&local_78);
      enqueueSubresUpload::anon_class_80_10_ff4bedf3::operator()
                (&local_c8,pvVar8,QVar9,subresDesc->m_dataStride);
    }
    goto LAB_004e20b5;
  }
  local_108.size._0_4_ = 0xaaaaaaaa;
  local_108.size._4_4_ = 0xaaaaaaaa;
  local_108.d._0_4_ = 0xaaaaaaaa;
  local_108.d._4_4_ = 0xaaaaaaaa;
  local_108.ptr._0_4_ = 0xaaaaaaaa;
  local_108.ptr._4_4_ = 0xaaaaaaaa;
  QImage::QImage((QImage *)&local_108,&subresDesc->m_image);
  QVar10 = QImage::size((QImage *)&local_108);
  QVar9 = subresDesc->m_sourceSize;
  uVar21 = (ulong)QVar9 >> 0x20;
  if (QVar9.ht.m_i < 1 || QVar9.wd.m_i < 1) {
    uVar21 = (ulong)QVar10 >> 0x20;
    QVar16 = subresDesc->m_sourceTopLeft;
    QVar9 = (QSize)((ulong)QVar10 & 0xffffffff);
    RVar20 = QVar10.wd.m_i;
    if (QVar16 != (QPoint)0x0) goto LAB_004e1e84;
  }
  else {
    QVar16 = subresDesc->m_sourceTopLeft;
LAB_004e1e84:
    RVar20 = QVar9.wd.m_i;
    if (((this->caps).field_0x3d & 4) == 0) {
      QImage::copy((QImage *)&byteSize,(EVP_PKEY_CTX *)&local_108,
                   (EVP_PKEY_CTX *)((ulong)QVar16 & 0xffffffff));
      QImage::operator=((QImage *)&local_108,(QImage *)&byteSize);
    }
    else {
      QGles2CommandBuffer::retainImage(cbD_local,(QImage *)&local_108);
      puVar11 = QImage::constBits((QImage *)&local_108);
      qVar12 = QImage::bytesPerLine((QImage *)&local_108);
      iVar6 = QImage::depth((QImage *)&local_108);
      iVar2 = 1;
      if (1 < iVar6 / 8) {
        iVar2 = iVar6 / 8;
      }
      bytesPerLine = QImage::bytesPerLine((QImage *)&local_108);
      format = QImage::format((QImage *)&local_108);
      QImage::QImage((QImage *)&byteSize,
                     puVar11 + (long)(iVar2 * QVar16.xp.m_i.m_i) + ((long)QVar16 >> 0x20) * qVar12,
                     RVar20.m_i,(int)uVar21,bytesPerLine,format,(QImageCleanupFunction)0x0,
                     (void *)0x0);
      QImage::operator=((QImage *)&local_108,(QImage *)&byteSize);
    }
    QImage::~QImage((QImage *)&byteSize);
  }
  pvVar8 = QGles2CommandBuffer::retainImage(cbD_local,(QImage *)&local_108);
  qVar12 = QImage::bytesPerLine((QImage *)&local_108);
  enqueueSubresUpload::anon_class_80_10_ff4bedf3::operator()
            (&local_c8,pvVar8,(QSize)((ulong)(uint)RVar20.m_i | uVar21 << 0x20),(quint32)qVar12);
  QImage::~QImage((QImage *)&local_108);
LAB_004e20b5:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::enqueueSubresUpload(QGles2Texture *texD, QGles2CommandBuffer *cbD,
                                    int layer, int level, const QRhiTextureSubresourceUploadDescription &subresDesc)
{
    trackedImageBarrier(cbD, texD, QGles2Texture::AccessUpdate);
    const bool isCompressed = isCompressedFormat(texD->m_format);
    const bool isCubeMap = texD->m_flags.testFlag(QRhiTexture::CubeMap);
    const bool is3D = texD->m_flags.testFlag(QRhiTexture::ThreeDimensional);
    const bool is1D = texD->m_flags.testFlag(QRhiTexture::OneDimensional);
    const bool isArray = texD->m_flags.testFlag(QRhiTexture::TextureArray);
    const GLenum faceTargetBase = isCubeMap ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : texD->target;
    const GLenum effectiveTarget = faceTargetBase + (isCubeMap ? uint(layer) : 0u);
    const QPoint dp = subresDesc.destinationTopLeft();
    const QByteArray rawData = subresDesc.data();

    auto setCmdByNotCompressedData = [&](const void* data, QSize size, quint32 dataStride)
    {
        quint32 bytesPerLine = 0;
        quint32 bytesPerPixel = 0;
        textureFormatInfo(texD->m_format, size, &bytesPerLine, nullptr, &bytesPerPixel);

        QGles2CommandBuffer::Command &cmd(cbD->commands.get());
        cmd.cmd = QGles2CommandBuffer::Command::SubImage;
        cmd.args.subImage.target = texD->target;
        cmd.args.subImage.texture = texD->texture;
        cmd.args.subImage.faceTarget = effectiveTarget;
        cmd.args.subImage.level = level;
        cmd.args.subImage.dx = dp.x();
        cmd.args.subImage.dy = is1D && isArray ? layer : dp.y();
        cmd.args.subImage.dz = is3D || isArray ? layer : 0;
        cmd.args.subImage.w = size.width();
        cmd.args.subImage.h = size.height();
        cmd.args.subImage.glformat = texD->glformat;
        cmd.args.subImage.gltype = texD->gltype;

        if (dataStride == 0)
            dataStride = bytesPerLine;

        cmd.args.subImage.rowStartAlign = (dataStride & 3) ? 1 : 4;
        cmd.args.subImage.rowLength = caps.unpackRowLength ? (bytesPerPixel ? dataStride / bytesPerPixel : 0) : 0;

        cmd.args.subImage.data = data;
    };

    if (!subresDesc.image().isNull()) {
        QImage img = subresDesc.image();
        QSize size = img.size();
        if (!subresDesc.sourceSize().isEmpty() || !subresDesc.sourceTopLeft().isNull()) {
            const QPoint sp = subresDesc.sourceTopLeft();
            if (!subresDesc.sourceSize().isEmpty())
                size = subresDesc.sourceSize();

            if (caps.unpackRowLength) {
                cbD->retainImage(img);
                // create a non-owning wrapper for the subimage
                const uchar *data = img.constBits() + sp.y() * img.bytesPerLine() + sp.x() * (qMax(1, img.depth() / 8));
                img = QImage(data, size.width(), size.height(), img.bytesPerLine(), img.format());
            } else {
                img = img.copy(sp.x(), sp.y(), size.width(), size.height());
            }
        }

        setCmdByNotCompressedData(cbD->retainImage(img), size, img.bytesPerLine());
    } else if (!rawData.isEmpty() && isCompressed) {
        const int depth = qMax(1, texD->m_depth);
        const int arraySize = qMax(0, texD->m_arraySize);
        if ((texD->flags().testFlag(QRhiTexture::UsedAsCompressedAtlas) || is3D || isArray)
                && !texD->zeroInitialized)
        {
            // Create on first upload since glCompressedTexImage2D cannot take
            // nullptr data. We have a rule in the QRhi docs that the first
            // upload for a compressed texture must cover the entire image, but
            // that is clearly not ideal when building a texture atlas, or when
            // having a 3D texture with per-slice data.
            quint32 byteSize = 0;
            compressedFormatInfo(texD->m_format, texD->m_pixelSize, nullptr, &byteSize, nullptr);
            if (is3D)
                byteSize *= depth;
            if (isArray)
                byteSize *= arraySize;
            QByteArray zeroBuf(byteSize, 0);
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedImage;
            cmd.args.compressedImage.target = texD->target;
            cmd.args.compressedImage.texture = texD->texture;
            cmd.args.compressedImage.faceTarget = effectiveTarget;
            cmd.args.compressedImage.level = level;
            cmd.args.compressedImage.glintformat = texD->glintformat;
            cmd.args.compressedImage.w = texD->m_pixelSize.width();
            cmd.args.compressedImage.h = is1D && isArray ? arraySize : texD->m_pixelSize.height();
            cmd.args.compressedImage.depth = is3D ? depth : (isArray ? arraySize : 0);
            cmd.args.compressedImage.size = byteSize;
            cmd.args.compressedImage.data = cbD->retainData(zeroBuf);
            texD->zeroInitialized = true;
        }

        const QSize size = subresDesc.sourceSize().isEmpty() ? q->sizeForMipLevel(level, texD->m_pixelSize)
                                                             : subresDesc.sourceSize();
        if (texD->specified || texD->zeroInitialized) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedSubImage;
            cmd.args.compressedSubImage.target = texD->target;
            cmd.args.compressedSubImage.texture = texD->texture;
            cmd.args.compressedSubImage.faceTarget = effectiveTarget;
            cmd.args.compressedSubImage.level = level;
            cmd.args.compressedSubImage.dx = dp.x();
            cmd.args.compressedSubImage.dy = is1D && isArray ? layer : dp.y();
            cmd.args.compressedSubImage.dz = is3D || isArray ? layer : 0;
            cmd.args.compressedSubImage.w = size.width();
            cmd.args.compressedSubImage.h = size.height();
            cmd.args.compressedSubImage.glintformat = texD->glintformat;
            cmd.args.compressedSubImage.size = rawData.size();
            cmd.args.compressedSubImage.data = cbD->retainData(rawData);
        } else {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::CompressedImage;
            cmd.args.compressedImage.target = texD->target;
            cmd.args.compressedImage.texture = texD->texture;
            cmd.args.compressedImage.faceTarget = effectiveTarget;
            cmd.args.compressedImage.level = level;
            cmd.args.compressedImage.glintformat = texD->glintformat;
            cmd.args.compressedImage.w = size.width();
            cmd.args.compressedImage.h = is1D && isArray ? arraySize : size.height();
            cmd.args.compressedImage.depth = is3D ? depth : (isArray ? arraySize : 0);
            cmd.args.compressedImage.size = rawData.size();
            cmd.args.compressedImage.data = cbD->retainData(rawData);
        }
    } else if (!rawData.isEmpty()) {
        const QSize size = subresDesc.sourceSize().isEmpty() ? q->sizeForMipLevel(level, texD->m_pixelSize)
                                                             : subresDesc.sourceSize();

        setCmdByNotCompressedData(cbD->retainData(rawData), size, subresDesc.dataStride());
    } else {
        qWarning("Invalid texture upload for %p layer=%d mip=%d", texD, layer, level);
    }
}